

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_at_most_n.hpp
# Opt level: O2

tuple<std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*> *
burst::detail::copy_at_most_n_impl<std::_Fwd_list_const_iterator<unsigned_int>,long,unsigned_int*>
          (tuple<std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*> *param_1,
          _Fwd_list_node_base *first,_Fwd_list_node_base *last,long n,uint *result)

{
  long m;
  long lVar1;
  
  for (lVar1 = 0; (first != last && (0 < n + lVar1)); lVar1 = lVar1 + -1) {
    *result = *(uint *)&first[1]._M_next;
    first = first->_M_next;
    result = result + 1;
  }
  (param_1->
  super__Tuple_impl<0UL,_std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*>).
  super__Tuple_impl<1UL,_long,_unsigned_int_*>.super__Tuple_impl<2UL,_unsigned_int_*>.
  super__Head_base<2UL,_unsigned_int_*,_false>._M_head_impl = result;
  (param_1->
  super__Tuple_impl<0UL,_std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*>).
  super__Tuple_impl<1UL,_long,_unsigned_int_*>.super__Head_base<1UL,_long,_false>._M_head_impl =
       -lVar1;
  (param_1->
  super__Tuple_impl<0UL,_std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*>).
  super__Head_base<0UL,_std::_Fwd_list_const_iterator<unsigned_int>,_false>._M_head_impl._M_node =
       first;
  return param_1;
}

Assistant:

std::tuple<InputIterator, Integral, OutputIterator>
            copy_at_most_n_impl
            (
                InputIterator first,
                InputIterator last,
                Integral n,
                OutputIterator result,
                std::input_iterator_tag
            )
        {
            auto m = n;
            while (first != last && m > 0)
            {
                *result = *first;

                ++first;
                ++result;
                --m;
            }

            return std::make_tuple(first, n - m, result);
        }